

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O1

int tcu::anon_unknown_50::findNumPositionDeviationFailingPixels
              (PixelBufferAccess *errorMask,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
              bool acceptOutOfBoundsAsAnyValue)

{
  ChannelOrder CVar1;
  ulong uVar2;
  int i;
  int iVar3;
  int iVar4;
  long lVar5;
  InternalError *this;
  int iVar6;
  ulong uVar7;
  ChannelOrder CVar8;
  int iVar9;
  int iVar10;
  int y;
  undefined3 in_register_00000089;
  uint uVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  Vector<int,_4> res_3;
  Vector<int,_4> res;
  UVec4 diff;
  IVec4 cmpPix;
  IVec4 refPix;
  IVec4 errorColor;
  IVec4 okColor;
  int local_104;
  int local_f4;
  int local_f0;
  TextureFormat local_e8;
  int aiStack_e0 [4];
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  TextureFormat local_b8;
  int aiStack_b0 [2];
  ConstPixelBufferAccess *local_a8;
  PixelBufferAccess *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [24];
  undefined1 local_70 [32];
  IVec4 local_50;
  IVec4 local_40;
  
  local_c8 = CONCAT31(in_register_00000089,acceptOutOfBoundsAsAnyValue);
  local_40.m_data[0] = 0;
  local_40.m_data[1] = 0xff;
  local_40.m_data[2] = 0;
  local_40.m_data[3] = 0xff;
  local_50.m_data[0] = 0xff;
  local_50.m_data[1] = 0;
  local_50.m_data[2] = 0;
  local_50.m_data[3] = 0xff;
  iVar9 = (reference->m_size).m_data[0];
  local_d0 = local_c8;
  local_cc = local_c8;
  if (local_c8 != 0) {
    local_cc = maxPositionDeviation->m_data[0];
    local_d0 = maxPositionDeviation->m_data[1];
    local_c8 = maxPositionDeviation->m_data[2];
  }
  local_a8 = reference;
  local_a0 = errorMask;
  if ((((result->m_size).m_data[0] != iVar9) ||
      (iVar10 = (reference->m_size).m_data[1], (result->m_size).m_data[1] != iVar10)) ||
     (iVar12 = (reference->m_size).m_data[2], (result->m_size).m_data[2] != iVar12)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x6c);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  local_c8 = iVar12 - local_c8;
  local_f4 = 0;
  local_f0 = 0;
  if (acceptOutOfBoundsAsAnyValue) {
    local_f0 = maxPositionDeviation->m_data[2];
  }
  local_88._16_8_ = result;
  clear(errorMask,&local_40);
  if (local_f0 < local_c8) {
    local_c0 = iVar9 - local_cc;
    local_c4 = iVar10 - local_d0;
    iVar12 = iVar12 + -1;
    iVar10 = iVar10 + -1;
    iVar9 = iVar9 + -1;
    local_f4 = 0;
    local_bc = iVar12;
    do {
      local_104 = local_d0;
      if (local_d0 < local_c4) {
        do {
          y = local_cc;
          if (local_cc < local_c0) {
            do {
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)(local_70 + 0x10),(int)local_a8,y,local_104);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_70,(int)local_88._16_8_,y,local_104);
              local_e8.order = R;
              local_e8.type = SNORM_INT8;
              aiStack_e0[0] = 0;
              aiStack_e0[1] = 0;
              lVar5 = 0;
              do {
                (&local_e8.order)[lVar5] =
                     (&local_50)[-1].m_data[lVar5] - *(int *)(local_70 + lVar5 * 4);
                lVar5 = lVar5 + 1;
              } while (lVar5 != 4);
              local_b8.order = R;
              local_b8.type = SNORM_INT8;
              aiStack_b0[0] = 0;
              aiStack_b0[1] = 0;
              lVar5 = 0;
              do {
                CVar1 = (&local_e8.order)[lVar5];
                CVar8 = -CVar1;
                if (0 < (int)CVar1) {
                  CVar8 = CVar1;
                }
                (&local_b8.order)[lVar5] = CVar8;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 4);
              local_88._0_4_ = local_b8.order;
              local_88._4_4_ = local_b8.type;
              local_88._8_4_ = aiStack_b0[0];
              local_88._12_4_ = aiStack_b0[1];
              local_b8 = (TextureFormat)((ulong)local_b8 & 0xffffffff00000000);
              lVar5 = 0;
              do {
                *(bool *)((long)&local_b8.order + lVar5) =
                     *(uint *)(local_88 + lVar5 * 4) <= threshold->m_data[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 4);
              if ((undefined1)local_b8.order == R) {
LAB_001de680:
                uVar11 = local_f0 - maxPositionDeviation->m_data[2];
                uVar13 = 0;
                if ((int)uVar11 < 1) {
                  uVar11 = uVar13;
                }
                iVar3 = maxPositionDeviation->m_data[2] + local_f0;
                if (iVar12 < iVar3) {
                  iVar3 = iVar12;
                }
                if ((int)uVar11 <= iVar3) {
                  uVar13 = 0;
                  do {
                    iVar12 = maxPositionDeviation->m_data[1];
                    iVar3 = local_104 - iVar12;
                    if (local_104 - iVar12 < 1) {
                      iVar3 = 0;
                    }
                    while( true ) {
                      iVar4 = iVar12 + local_104;
                      if (iVar10 < iVar12 + local_104) {
                        iVar4 = iVar10;
                      }
                      if ((iVar4 < iVar3) || (uVar13 != 0)) break;
                      iVar12 = y - maxPositionDeviation->m_data[0];
                      if (iVar12 < 1) {
                        iVar12 = 0;
                      }
                      iVar4 = maxPositionDeviation->m_data[0] + y;
                      if (iVar9 < iVar4) {
                        iVar4 = iVar9;
                      }
                      if (iVar12 <= iVar4) {
                        do {
                          ConstPixelBufferAccess::getPixelInt
                                    ((ConstPixelBufferAccess *)local_88,(int)local_88._16_8_,iVar12,
                                     iVar3);
                          local_98 = 0;
                          uStack_90 = 0;
                          lVar5 = 0;
                          do {
                            *(int *)((long)&local_98 + lVar5 * 4) =
                                 (&local_50)[-1].m_data[lVar5] - *(int *)(local_88 + lVar5 * 4);
                            lVar5 = lVar5 + 1;
                          } while (lVar5 != 4);
                          local_e8.order = R;
                          local_e8.type = SNORM_INT8;
                          aiStack_e0[0] = 0;
                          aiStack_e0[1] = 0;
                          lVar5 = 0;
                          do {
                            CVar1 = *(ChannelOrder *)((long)&local_98 + lVar5 * 4);
                            CVar8 = -CVar1;
                            if (0 < (int)CVar1) {
                              CVar8 = CVar1;
                            }
                            (&local_e8.order)[lVar5] = CVar8;
                            lVar5 = lVar5 + 1;
                          } while (lVar5 != 4);
                          local_b8 = local_e8;
                          aiStack_b0[0] = aiStack_e0[0];
                          aiStack_b0[1] = aiStack_e0[1];
                          local_e8 = (TextureFormat)((ulong)local_e8 & 0xffffffff00000000);
                          lVar5 = 0;
                          do {
                            *(bool *)((long)&local_e8.order + lVar5) =
                                 (&local_b8.order)[lVar5] <= threshold->m_data[lVar5];
                            lVar5 = lVar5 + 1;
                          } while (lVar5 != 4);
                          if ((undefined1)local_e8.order == R) {
                            uVar13 = 0;
                          }
                          else {
                            uVar2 = 0;
                            do {
                              uVar7 = uVar2;
                              if (uVar7 == 3) break;
                              uVar2 = uVar7 + 1;
                            } while (*(char *)((long)&local_e8.order + uVar7 + 1) != '\0');
                            uVar13 = (uint)(2 < uVar7);
                          }
                          iVar12 = iVar12 + 1;
                          iVar4 = maxPositionDeviation->m_data[0] + y;
                          if (iVar9 < iVar4) {
                            iVar4 = iVar9;
                          }
                        } while ((iVar12 <= iVar4) && ((char)uVar13 == '\0'));
                      }
                      iVar12 = maxPositionDeviation->m_data[1];
                      iVar3 = iVar3 + 1;
                    }
                    uVar11 = uVar11 + 1;
                    iVar3 = maxPositionDeviation->m_data[2] + local_f0;
                    if (local_bc < iVar3) {
                      iVar3 = local_bc;
                    }
                    iVar12 = local_bc;
                  } while (((int)uVar11 <= iVar3) && (uVar13 == 0));
                }
                if (uVar13 == 0) {
                  PixelBufferAccess::setPixel(local_a0,&local_50,y,local_104,local_f0);
                  local_f4 = local_f4 + 1;
                }
                else {
                  iVar3 = local_f0 - maxPositionDeviation->m_data[2];
                  if (iVar3 < 1) {
                    iVar3 = 0;
                  }
                  iVar4 = maxPositionDeviation->m_data[2] + local_f0;
                  if (iVar12 < iVar4) {
                    iVar4 = iVar12;
                  }
                  if (iVar3 <= iVar4) {
                    bVar14 = false;
                    do {
                      iVar12 = maxPositionDeviation->m_data[1];
                      iVar4 = local_104 - iVar12;
                      if (local_104 - iVar12 < 1) {
                        iVar4 = 0;
                      }
                      while( true ) {
                        iVar6 = iVar12 + local_104;
                        if (iVar10 < iVar12 + local_104) {
                          iVar6 = iVar10;
                        }
                        if ((iVar6 < iVar4) || (bVar14)) break;
                        iVar12 = y - maxPositionDeviation->m_data[0];
                        if (iVar12 < 1) {
                          iVar12 = 0;
                        }
                        iVar6 = maxPositionDeviation->m_data[0] + y;
                        if (iVar9 < iVar6) {
                          iVar6 = iVar9;
                        }
                        if (iVar12 <= iVar6) {
                          do {
                            if (bVar14) break;
                            ConstPixelBufferAccess::getPixelInt
                                      ((ConstPixelBufferAccess *)local_88,(int)local_a8,iVar12,iVar4
                                      );
                            local_98 = 0;
                            uStack_90 = 0;
                            lVar5 = 0;
                            do {
                              *(int *)((long)&local_98 + lVar5 * 4) =
                                   *(int *)(local_70 + lVar5 * 4) - *(int *)(local_88 + lVar5 * 4);
                              lVar5 = lVar5 + 1;
                            } while (lVar5 != 4);
                            local_e8.order = R;
                            local_e8.type = SNORM_INT8;
                            aiStack_e0[0] = 0;
                            aiStack_e0[1] = 0;
                            lVar5 = 0;
                            do {
                              CVar1 = *(ChannelOrder *)((long)&local_98 + lVar5 * 4);
                              CVar8 = -CVar1;
                              if (0 < (int)CVar1) {
                                CVar8 = CVar1;
                              }
                              (&local_e8.order)[lVar5] = CVar8;
                              lVar5 = lVar5 + 1;
                            } while (lVar5 != 4);
                            local_b8 = local_e8;
                            aiStack_b0[0] = aiStack_e0[0];
                            aiStack_b0[1] = aiStack_e0[1];
                            local_e8 = (TextureFormat)((ulong)local_e8 & 0xffffffff00000000);
                            lVar5 = 0;
                            do {
                              *(bool *)((long)&local_e8.order + lVar5) =
                                   (&local_b8.order)[lVar5] <= threshold->m_data[lVar5];
                              lVar5 = lVar5 + 1;
                            } while (lVar5 != 4);
                            if ((undefined1)local_e8.order == R) {
                              bVar14 = false;
                            }
                            else {
                              uVar2 = 0;
                              do {
                                uVar7 = uVar2;
                                if (uVar7 == 3) break;
                                uVar2 = uVar7 + 1;
                              } while (*(char *)((long)&local_e8.order + uVar7 + 1) != '\0');
                              bVar14 = 2 < uVar7;
                            }
                            iVar12 = iVar12 + 1;
                            iVar6 = maxPositionDeviation->m_data[0] + y;
                            if (iVar9 < iVar6) {
                              iVar6 = iVar9;
                            }
                          } while (iVar12 <= iVar6);
                        }
                        iVar12 = maxPositionDeviation->m_data[1];
                        iVar4 = iVar4 + 1;
                      }
                      iVar3 = iVar3 + 1;
                      iVar12 = maxPositionDeviation->m_data[2] + local_f0;
                      if (local_bc < iVar12) {
                        iVar12 = local_bc;
                      }
                    } while ((iVar3 <= iVar12) && (!bVar14));
                    iVar12 = local_bc;
                    if (bVar14) goto LAB_001dea3b;
                  }
                  PixelBufferAccess::setPixel(local_a0,&local_50,y,local_104,local_f0);
                  local_f4 = local_f4 + 1;
                }
              }
              else {
                uVar2 = 0;
                do {
                  uVar7 = uVar2;
                  if (uVar7 == 3) break;
                  uVar2 = uVar7 + 1;
                } while (*(char *)((long)&local_b8.order + uVar7 + 1) != '\0');
                if (uVar7 < 3) goto LAB_001de680;
              }
LAB_001dea3b:
              y = y + 1;
            } while (y < local_c0);
          }
          local_104 = local_104 + 1;
        } while (local_104 < local_c4);
      }
      local_f0 = local_f0 + 1;
    } while (local_f0 < local_c8);
  }
  return local_f4;
}

Assistant:

static int findNumPositionDeviationFailingPixels (const PixelBufferAccess& errorMask, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue)
{
	const tcu::IVec4	okColor				(0, 255, 0, 255);
	const tcu::IVec4	errorColor			(255, 0, 0, 255);
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	int					numFailingPixels	= 0;

	// Accept pixels "sampling" over the image bounds pixels since "taps" could be anything
	const int			beginX				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.x()) : (0);
	const int			beginY				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.y()) : (0);
	const int			beginZ				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.z()) : (0);
	const int			endX				= (acceptOutOfBoundsAsAnyValue) ? (width  - maxPositionDeviation.x()) : (width);
	const int			endY				= (acceptOutOfBoundsAsAnyValue) ? (height - maxPositionDeviation.y()) : (height);
	const int			endZ				= (acceptOutOfBoundsAsAnyValue) ? (depth  - maxPositionDeviation.z()) : (depth);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);
	DE_ASSERT(endX > 0 && endY > 0 && endZ > 0);	// most likely a bug

	tcu::clear(errorMask, okColor);

	for (int z = beginZ; z < endZ; z++)
	{
		for (int y = beginY; y < endY; y++)
		{
			for (int x = beginX; x < endX; x++)
			{
				const IVec4	refPix = reference.getPixelInt(x, y, z);
				const IVec4	cmpPix = result.getPixelInt(x, y, z);

				// Exact match
				{
					const UVec4	diff = abs(refPix - cmpPix).cast<deUint32>();
					const bool	isOk = boolAll(lessThanEqual(diff, threshold));

					if (isOk)
						continue;
				}

				// Find matching pixels for both result and reference pixel

				{
					bool pixelFoundForReference = false;

					// Find deviated result pixel for reference

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForReference; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForReference; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForReference; ++sx)
					{
						const IVec4	deviatedCmpPix	= result.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(refPix - deviatedCmpPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForReference		= isOk;
					}

					if (!pixelFoundForReference)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
				{
					bool pixelFoundForResult = false;

					// Find deviated reference pixel for result

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForResult; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForResult; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForResult; ++sx)
					{
						const IVec4	deviatedRefPix	= reference.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(cmpPix - deviatedRefPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForResult			= isOk;
					}

					if (!pixelFoundForResult)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
			}
		}
	}

	return numFailingPixels;
}